

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

bool kratos::is_unary_op(ExprOp op)

{
  initializer_list<kratos::ExprOp> __l;
  bool bVar1;
  int iVar2;
  _Node_iterator_base<kratos::ExprOp,_false> local_80;
  _Node_iterator_base<kratos::ExprOp,_false> local_78 [3];
  allocator<kratos::ExprOp> local_5b;
  key_equal local_5a;
  hasher local_59;
  ExprOp local_58 [7];
  iterator local_20;
  size_type local_18;
  ExprOp local_10;
  ExprOp op_local;
  
  local_10 = op;
  if (is_unary_op(kratos::ExprOp)::ops == '\0') {
    iVar2 = __cxa_guard_acquire(&is_unary_op(kratos::ExprOp)::ops);
    if (iVar2 != 0) {
      local_58[4] = 6;
      local_58[5] = 0;
      local_58[2] = 3;
      local_58[3] = 4;
      local_58[0] = UXor;
      local_58[1] = 2;
      local_58[6] = 1;
      local_20 = local_58;
      local_18 = 7;
      std::allocator<kratos::ExprOp>::allocator(&local_5b);
      __l._M_len = local_18;
      __l._M_array = local_20;
      std::
      unordered_set<kratos::ExprOp,_std::hash<kratos::ExprOp>,_std::equal_to<kratos::ExprOp>,_std::allocator<kratos::ExprOp>_>
      ::unordered_set(&is_unary_op::ops,__l,0,&local_59,&local_5a,&local_5b);
      std::allocator<kratos::ExprOp>::~allocator(&local_5b);
      __cxa_atexit(std::
                   unordered_set<kratos::ExprOp,_std::hash<kratos::ExprOp>,_std::equal_to<kratos::ExprOp>,_std::allocator<kratos::ExprOp>_>
                   ::~unordered_set,&is_unary_op::ops,&__dso_handle);
      __cxa_guard_release(&is_unary_op(kratos::ExprOp)::ops);
    }
  }
  local_78[0]._M_cur =
       (__node_type *)
       std::
       unordered_set<kratos::ExprOp,_std::hash<kratos::ExprOp>,_std::equal_to<kratos::ExprOp>,_std::allocator<kratos::ExprOp>_>
       ::find(&is_unary_op::ops,&local_10);
  local_80._M_cur =
       (__node_type *)
       std::
       unordered_set<kratos::ExprOp,_std::hash<kratos::ExprOp>,_std::equal_to<kratos::ExprOp>,_std::allocator<kratos::ExprOp>_>
       ::end(&is_unary_op::ops);
  bVar1 = std::__detail::operator!=(local_78,&local_80);
  return bVar1;
}

Assistant:

bool is_unary_op(ExprOp op) {
    static std::unordered_set<ExprOp> ops = {ExprOp::UXor,  ExprOp::UPlus, ExprOp::UOr,
                                             ExprOp::UNot,  ExprOp::UXor,  ExprOp::UInvert,
                                             ExprOp::UMinus};
    return ops.find(op) != ops.end();
}